

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O3

string * __thiscall
google::protobuf::json_internal::MaybeOwnedString::ToString_abi_cxx11_(MaybeOwnedString *this)

{
  variant_alternative_t<0UL,_variant<basic_string<char>,_StreamOwned>_> *pvVar1;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(__index_type *)
       ((long)&(this->data_).
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
       + 0x20) == '\x01') {
    sVar2 = ZeroCopyBufferedStream::RawBuffer
                      (*(ZeroCopyBufferedStream **)
                        &(this->data_).
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         .
                         super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         .
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         .
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         .
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         .
                         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                       ,*(size_t *)
                         ((long)&(this->data_).
                                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                 .
                                 super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                 .
                                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                 .
                                 super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                 .
                                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                 .
                                 super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                         + 8),*(size_t *)
                               ((long)&(this->data_).
                                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                       .
                                       super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                       .
                                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                       .
                                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                       .
                                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                                       .
                                       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                               + 0x10));
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,sVar2._M_str,sVar2._M_str + sVar2._M_len);
    std::
    variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>::
    operator=((variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               *)this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    local_38._M_dataplus._M_p = (pointer)0x0;
    BufferingGuard::operator=(&this->token_,(BufferingGuard *)&local_38);
    if ((ZeroCopyBufferedStream *)local_38._M_dataplus._M_p != (ZeroCopyBufferedStream *)0x0) {
      ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_38._M_dataplus._M_p);
    }
  }
  pvVar1 = std::
           get<0ul,std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                     (&this->data_);
  return pvVar1;
}

Assistant:

std::string& ToString() {
    if (auto* unowned = absl::get_if<StreamOwned>(&data_)) {
      data_ = std::string(unowned->AsView());
      token_ = BufferingGuard{};
    }

    return absl::get<std::string>(data_);
  }